

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_chr.cpp
# Opt level: O2

void combine_chr(double *p_value_g,int m,int num_chr,int *m_chr,double **NM)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  void *pvVar8;
  ulong uVar9;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  int i;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  
  uVar9 = (ulong)(num_chr + 1) << 3;
  if (num_chr < -1) {
    uVar9 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar9);
  uVar9 = (ulong)(m + 1) << 3;
  if (m < -1) {
    uVar9 = 0xffffffffffffffff;
  }
  lVar15 = (long)m;
  lVar16 = (long)num_chr;
  for (lVar13 = 0; lVar13 <= lVar16; lVar13 = lVar13 + 1) {
    pvVar10 = operator_new__(uVar9);
    *(void **)((long)pvVar8 + lVar13 * 8) = pvVar10;
    for (lVar11 = 0; lVar11 <= lVar15; lVar11 = lVar11 + 1) {
      *(undefined8 *)((long)pvVar10 + lVar11 * 8) = 0xbff0000000000000;
    }
  }
  if (num_chr < 1) {
    num_chr = 0;
  }
  uVar17 = 1;
  do {
    if (uVar17 == num_chr + 1) {
      dVar20 = -1.0;
      for (lVar13 = 0; lVar13 <= lVar15; lVar13 = lVar13 + 1) {
        dVar20 = logsum(dVar20,*(double *)(*(long *)((long)pvVar8 + lVar16 * 8) + lVar13 * 8));
      }
      pvVar10 = operator_new__(uVar9);
      lVar13 = lVar15;
      for (lVar11 = 0; lVar11 <= lVar15; lVar11 = lVar11 + 1) {
        if (lVar11 == 0) {
          *(undefined8 *)((long)pvVar10 + lVar15 * 8) =
               *(undefined8 *)(*(long *)((long)pvVar8 + lVar16 * 8) + lVar15 * 8);
        }
        else {
          dVar19 = logsum(*(double *)((long)pvVar10 + lVar13 * 8 + 8),
                          *(double *)(*(long *)((long)pvVar8 + lVar16 * 8) + lVar13 * 8));
          *(double *)((long)pvVar10 + lVar13 * 8) = dVar19;
        }
        lVar13 = lVar13 + -1;
      }
      for (lVar13 = 0; lVar13 <= lVar15; lVar13 = lVar13 + 1) {
        dVar19 = exp(*(double *)((long)pvVar10 + lVar13 * 8) - dVar20);
        p_value_g[lVar13] = dVar19;
      }
      for (lVar13 = 0; lVar13 <= lVar16; lVar13 = lVar13 + 1) {
        pvVar4 = *(void **)((long)pvVar8 + lVar13 * 8);
        if (pvVar4 != (void *)0x0) {
          operator_delete__(pvVar4);
        }
      }
      operator_delete__(pvVar8);
      operator_delete__(pvVar10);
      return;
    }
    lVar11 = 0;
    for (lVar13 = 0; lVar13 <= lVar15; lVar13 = lVar13 + 1) {
      if (lVar13 == 0) {
        pdVar1 = *(double **)((long)pvVar8 + uVar17 * 8);
        *pdVar1 = 0.0;
        dVar20 = 0.0;
        bVar5 = false;
        for (uVar12 = 0; uVar17 != uVar12; uVar12 = uVar12 + 1) {
          pdVar2 = NM[uVar12 + 1];
          dVar20 = dVar20 + *pdVar2;
          *pdVar1 = dVar20;
          dVar19 = *pdVar2;
          bVar6 = true;
          if (dVar19 != -1.0) {
            bVar6 = bVar5;
          }
          if (!NAN(dVar19)) {
            bVar5 = bVar6;
          }
        }
        if (bVar5) {
          *pdVar1 = -1.0;
        }
      }
      else if (uVar17 == 1) {
        *(double *)(*(long *)((long)pvVar8 + 8) + lVar13 * 8) = NM[1][lVar13];
      }
      else {
        lVar14 = 0;
        lVar18 = lVar11;
        while( true ) {
          iVar7 = m_chr[uVar17];
          if ((int)lVar13 <= m_chr[uVar17]) {
            iVar7 = (int)lVar13;
          }
          if (iVar7 < lVar14) break;
          dVar20 = NM[uVar17][lVar14];
          if ((dVar20 != -1.0) || (NAN(dVar20))) {
            dVar19 = *(double *)(*(long *)((long)pvVar8 + uVar17 * 8 + -8) + lVar18);
            if ((dVar19 == -1.0) && (!NAN(dVar19))) goto LAB_0010628a;
            dVar20 = dVar20 + dVar19;
          }
          else {
LAB_0010628a:
            dVar20 = -1.0;
          }
          lVar3 = *(long *)((long)pvVar8 + uVar17 * 8);
          dVar20 = logsum(*(double *)(lVar3 + lVar13 * 8),dVar20);
          *(double *)(lVar3 + lVar13 * 8) = dVar20;
          lVar14 = lVar14 + 1;
          lVar18 = lVar18 + -8;
        }
      }
      lVar11 = lVar11 + 8;
    }
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

void combine_chr(double* p_value_g, int m, int num_chr, int* m_chr, double** NM)
{
    double** M;
    M = new double* [num_chr+1];
    for(int q=0; q<=num_chr; q++)
    {
        M[q] = new double [m+1];
        for(int k=0; k<=m; k++)
            M[q][k] = -1;
    }
    for(int q=1; q<=num_chr; q++)
    {
        for(int k=0; k<=m; k++)
        {
            if (k==0)
            {
                M[q][0] = 0;
                int flag = 0;
                for(int j=1; j<=q; j++){
                    M[q][0] += NM[j][0];
                    if (NM[j][0]==-1)
                        flag = 1;
                }
                if (flag==1)
                    M[q][0] = -1;
            }
            else if (q==1)
                M[1][k] = NM[1][k]; //could lower max_m_chr by taking care of this
            else
            {
                double temp = -1;
                for(int i=0; i<=min(k,m_chr[q]); i++)
                {
                    temp = M[q-1][k-i]+NM[q][i];
                    if (NM[q][i]==-1 || M[q-1][k-i]==-1)
                        temp = -1;
                    M[q][k] = logsum(M[q][k], temp);
                }
            }
        }
    }

    double Sum1 = -1;
    for(int k=0; k<=m; k++) {
        Sum1 = logsum(Sum1, M[num_chr][k]);
    }

    double* CumSum = new double [m+1];
    for(int k=0; k<=m; k++) {
        if (k==0) {
            CumSum[m] = M[num_chr][m];
        }
        else CumSum[m-k] = logsum(CumSum[m-k+1], M[num_chr][m-k]);
    }

    for(int k=0; k<=m; k++) {
        p_value_g[k] = exp(CumSum[k] - Sum1);
    }

    for(int i=0; i<=num_chr; i++)
    {
        delete [] M[i];
    }
    delete [] M;
    delete [] CumSum;
    return;
}